

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O0

void __thiscall level_aux_mesh::build(level_aux_mesh *this,xr_level_hom *hom)

{
  bool bVar1;
  uint32_t uVar2;
  hom_poly *phVar3;
  uint local_a0;
  uint local_9c;
  hom_poly *local_98;
  hom_poly *end;
  hom_poly *it;
  b_face face;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> refs;
  uint32_t face_idx;
  xr_level_hom *hom_local;
  level_aux_mesh *this_local;
  
  refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  uVar2 = xray_re::xr_level_hom::num_polys(hom);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(ulong)(uVar2 * 3));
  uVar2 = xray_re::xr_level_hom::num_polys(hom);
  std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
  reserve(&(this->super_xr_mesh_builder).m_faces,(ulong)uVar2);
  xray_re::xr_mesh_builder::b_face::b_face((b_face *)&it);
  phVar3 = xray_re::xr_level_hom::polys(hom);
  end = phVar3;
  uVar2 = xray_re::xr_level_hom::num_polys(hom);
  local_98 = phVar3 + uVar2;
  for (; end != local_98; end = end + 1) {
    bVar1 = xray_re::_vector3<float>::operator==((_vector3<float> *)end,&(end->field_0).field_0.v1);
    if (((!bVar1) &&
        (bVar1 = xray_re::_vector3<float>::operator==
                           ((_vector3<float> *)end,&(end->field_0).field_0.v2), !bVar1)) &&
       (bVar1 = xray_re::_vector3<float>::operator==
                          (&(end->field_0).field_0.v1,&(end->field_0).field_0.v2), !bVar1)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                 (value_type_conflict2 *)
                 ((long)&refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_9c = refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ | 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,&local_9c);
      local_a0 = refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ | 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,&local_a0);
      refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 4;
      xray_re::xr_raw_surface::set
                ((xr_raw_surface *)((long)&face.field_0 + 0x28),0,0,0,
                 (uint16_t)((end->flags & 1) << 3));
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      push_back(&(this->super_xr_mesh_builder).m_faces,(value_type *)&it);
    }
  }
  if (refs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    phVar3 = xray_re::xr_level_hom::polys(hom);
    compact_vertices<xray_re::hom_poly>
              (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,phVar3);
    create_uvs(this);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return;
}

Assistant:

void level_aux_mesh::build(const xr_level_hom& hom)
{
	uint32_t face_idx = 0;
	std::vector<uint32_t> refs;
	refs.reserve(3*hom.num_polys());
	m_faces.reserve(hom.num_polys());
	b_face face;
	for (const hom_poly *it = hom.polys(), *end = it + hom.num_polys(); it != end; ++it) {
		if (it->v0 == it->v1 || it->v0 == it->v2 || it->v1 == it->v2)
			continue;
		refs.push_back(face_idx);
		refs.push_back(face_idx | 1);
		refs.push_back(face_idx | 2);
		face_idx += 4;
		face.surface.set(0, 0, 0, (it->flags & 0x1) ? RSF_TWO_SIDED : 0);
		m_faces.push_back(face);
	}
	if (face_idx) {
		compact_vertices(refs, hom.polys());
		create_uvs();
	}
}